

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

xlik_object xlik_init(int p,int d,int q,int s,int P,int D,int Q,int M,int N)

{
  uint uVar1;
  uint uVar2;
  xlik_object pxVar3;
  uint uVar4;
  double dVar5;
  
  uVar4 = P * s + p;
  uVar1 = Q * s + 1 + q;
  uVar2 = uVar1;
  if (Q * s + q < (int)uVar4) {
    uVar2 = uVar4;
  }
  pxVar3 = (xlik_object)malloc((long)(int)uVar2 * 0x10 + (long)(M + 3) * (long)N * 8 + 0x60);
  pxVar3->p = p;
  pxVar3->d = d;
  pxVar3->q = q;
  pxVar3->s = s;
  pxVar3->P = P;
  pxVar3->D = D;
  pxVar3->Q = Q;
  pxVar3->N = N;
  pxVar3->M = M;
  pxVar3->length = N;
  pxVar3->pq = q + p + P + Q + M;
  if ((int)uVar1 < (int)uVar4) {
    uVar1 = uVar4;
  }
  pxVar3->r = uVar1;
  pxVar3->offset = uVar1 * 2;
  if (0 < (int)uVar1) {
    memset(pxVar3->x,0,(ulong)uVar1 << 3);
    memset(pxVar3->x + (int)uVar2,0,(ulong)uVar1 << 3);
  }
  dVar5 = macheps();
  pxVar3->eps = dVar5;
  pxVar3->mean = 0.0;
  return pxVar3;
}

Assistant:

xlik_object xlik_init(int p, int d, int q, int s, int P, int D, int Q, int M, int N) {
	xlik_object obj = NULL;
	int i,r, t;

	r = p + s*P;

	t = q + s*Q + 1;

	if (r < t) {
		r = t;
	}
	else {
		t = r;
	}

	obj = (xlik_object)malloc(sizeof(struct xlik_set) + sizeof(double) * 2 * r + sizeof(double)* (3+M) * N);

	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->s = s;
	obj->P = P;
	obj->D = D;
	obj->Q = Q;
	obj->N = N;
	obj->M = M; // This will include the mean term and the exogenous terms
	obj->length = N;
	obj->pq = p + q + P + Q + M;


	obj->r = p + s * P;

	t = 1 + q + s*Q;
	if (obj->r < t) {
		obj->r = t;
	}
	t = obj->r;
	obj->offset = 2 * obj->r;

	for (i = 0; i < t; ++i) {
		obj->x[i] = 0.0;// phi
	}

	for (i = 0; i < t; ++i) {
		obj->x[i+r] = 0.0;//theta
	}
	obj->eps = macheps();
	obj->mean = 0.0;

	return obj;
}